

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O1

int xmlSchematronRegisterVariables
              (xmlSchematronValidCtxtPtr vctxt,xmlXPathContextPtr_conflict ctxt,
              xmlSchematronLetPtr_conflict let,xmlDocPtr instance,xmlNodePtr cur)

{
  int iVar1;
  xmlDocPtr value;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *msg;
  int error;
  
  ctxt->doc = instance;
  ctxt->node = cur;
  if (let == (xmlSchematronLetPtr_conflict)0x0) {
    return 0;
  }
  error = 0x1e8f98;
  do {
    value = (xmlDocPtr)xmlXPathCompiledEval(let->comp,ctxt);
    msg = extraout_RDX;
    if (value == (xmlDocPtr)0x0) {
LAB_001b3a79:
      xmlSchematronVErr(vctxt,error,msg,(xmlChar *)instance);
      return -1;
    }
    iVar1 = xmlXPathRegisterVariableNS(ctxt,let->name,(xmlChar *)0x0,(xmlXPathObjectPtr)value);
    instance = value;
    if (iVar1 != 0) {
      error = 0x1e8fc2;
      msg = extraout_RDX_00;
      goto LAB_001b3a79;
    }
    let = let->next;
    if (let == (xmlSchematronLetPtr)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
xmlSchematronRegisterVariables(xmlSchematronValidCtxtPtr vctxt,
                               xmlXPathContextPtr ctxt,
                               xmlSchematronLetPtr let,
                               xmlDocPtr instance, xmlNodePtr cur)
{
    xmlXPathObjectPtr let_eval;

    ctxt->doc = instance;
    ctxt->node = cur;
    while (let != NULL) {
        let_eval = xmlXPathCompiledEval(let->comp, ctxt);
        if (let_eval == NULL) {
            xmlSchematronVErr(vctxt, XML_ERR_INTERNAL_ERROR,
                              "Evaluation of compiled expression failed\n",
                              NULL);
            return -1;
        }
        if(xmlXPathRegisterVariableNS(ctxt, let->name, NULL, let_eval)) {
            xmlSchematronVErr(vctxt, XML_ERR_INTERNAL_ERROR,
                              "Registering a let variable failed\n", NULL);
            return -1;
        }
        let = let->next;
    }
    return 0;
}